

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O3

Matrix2f operator*(float f,Matrix2f *m)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  Matrix2f *output;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Db;
  Matrix2f MVar4;
  
  MVar4.m_elements[1] = (float)in_XMM0_Db;
  MVar4.m_elements[0] = f;
  *in_RDI = 0;
  in_RDI[1] = 0;
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    *(float *)((long)in_RDI + lVar3 * 4) = m->m_elements[lVar3] * f;
    MVar4.m_elements[2] = m->m_elements[lVar3 + 2] * f;
    *(float *)((long)in_RDI + lVar3 * 4 + 8) = MVar4.m_elements[2];
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  MVar4.m_elements[3] = 0.0;
  return (Matrix2f)MVar4.m_elements;
}

Assistant:

Matrix2f operator * ( float f, const Matrix2f& m )
{
	Matrix2f output;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			output( i, j ) = f * m( i, j );
		}
	}

	return output;
}